

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigSudokuVisualizer.cpp
# Opt level: O2

string * __thiscall
BigSudokuVisualizer::createBorderTopStyle_abi_cxx11_
          (string *__return_storage_ptr__,BigSudokuVisualizer *this,SudokuGitter *gitter)

{
  uint uVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  string local_50;
  
  uVar1 = gitter->elements;
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  uVar2 = 0;
  while( true ) {
    if (uVar1 <= uVar2) break;
    __val = uVar2 * uVar1;
    uVar3 = uVar1 + __val;
    for (; __val < uVar3; __val = __val + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::to_string(&local_50,__val);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    uVar2 = uVar2 + gitter->quadHeight;
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string BigSudokuVisualizer::createBorderTopStyle(SudokuGitter gitter) {
    unsigned int size = gitter.getElements();
    unsigned int h = 0;
    std::string border_top = "";
    while (h < size) {
        unsigned int iStart = h * size;
        for (unsigned int i = iStart; i < iStart + size; i++) {
            border_top.append("#bigCell-");
            border_top.append(std::to_string(i));
            border_top.append(", ");
        }
        h += gitter.getQuadHeight();
    }
    border_top = border_top.substr(0, border_top.length() - 2);
    border_top.append(" { border-top: 2px solid #000; } ");
    return border_top;
}